

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O2

string * __thiscall
vkt::tessellation::getTessellationLevelsString_abi_cxx11_
          (string *__return_storage_ptr__,tessellation *this,TessLevels *tessLevels,
          TessPrimitiveType primitiveType)

{
  ostream *poVar1;
  int iVar2;
  long lStack_1a0;
  ostringstream str;
  
  iVar2 = (int)tessLevels;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
  if (iVar2 == 0) {
    poVar1 = std::operator<<((ostream *)&str,"inner: { ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)this);
    poVar1 = std::operator<<(poVar1," }, ");
    poVar1 = std::operator<<(poVar1,"outer: { ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(this + 8));
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(this + 0xc));
    poVar1 = std::operator<<(poVar1,", ");
    lStack_1a0 = 0x10;
  }
  else if (iVar2 == 1) {
    poVar1 = std::operator<<((ostream *)&str,"inner: { ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)this);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(this + 4));
    poVar1 = std::operator<<(poVar1," }, ");
    poVar1 = std::operator<<(poVar1,"outer: { ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(this + 8));
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(this + 0xc));
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(this + 0x10));
    poVar1 = std::operator<<(poVar1,", ");
    lStack_1a0 = 0x14;
  }
  else {
    if (iVar2 != 2) goto LAB_0073e617;
    poVar1 = std::operator<<((ostream *)&str,"inner: { }, ");
    poVar1 = std::operator<<(poVar1,"outer: { ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(this + 8));
    poVar1 = std::operator<<(poVar1,", ");
    lStack_1a0 = 0xc;
  }
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(this + lStack_1a0));
  std::operator<<(poVar1," }");
LAB_0073e617:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
  return __return_storage_ptr__;
}

Assistant:

std::string getTessellationLevelsString (const TessLevels& tessLevels, const TessPrimitiveType primitiveType)
{
	std::ostringstream str;
	switch (primitiveType)
	{
		case TESSPRIMITIVETYPE_ISOLINES:
			str << "inner: { }, "
				<< "outer: { " << tessLevels.outer[0] << ", " << tessLevels.outer[1] << " }";
			break;

		case TESSPRIMITIVETYPE_TRIANGLES:
			str << "inner: { " << tessLevels.inner[0] << " }, "
				<< "outer: { " << tessLevels.outer[0] << ", " << tessLevels.outer[1] << ", " << tessLevels.outer[2] << " }";
			break;

		case TESSPRIMITIVETYPE_QUADS:
			str << "inner: { " << tessLevels.inner[0] << ", " << tessLevels.inner[1] << " }, "
				<< "outer: { " << tessLevels.outer[0] << ", " << tessLevels.outer[1] << ", " << tessLevels.outer[2] << ", " << tessLevels.outer[3] << " }";
			break;

		default:
			DE_ASSERT(false);
	}

	return str.str();
}